

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stb_sdict * stb_sdict_copy(stb_sdict *old)

{
  void *pvVar1;
  stb_sdict *psVar2;
  void *local_30;
  void *new_arena;
  void *old_arena;
  stb_sdict *n;
  stb_sdict *old_local;
  
  pvVar1 = old->arena;
  if (pvVar1 == (void *)0x0) {
    local_30 = (void *)0x0;
  }
  else {
    local_30 = stb_malloc_global(1);
  }
  old->arena = local_30;
  psVar2 = stb_sdictinternal_copy(old);
  old->arena = pvVar1;
  if (psVar2 == (stb_sdict *)0x0) {
    if (local_30 != (void *)0x0) {
      stb_free(local_30);
    }
  }
  else {
    psVar2->arena = local_30;
  }
  return psVar2;
}

Assistant:

stb_sdict* stb_sdict_copy(stb_sdict *old)
{
   stb_sdict *n;
   void *old_arena = old->arena;
   void *new_arena = old_arena ? stb_malloc_global(1) : NULL;
   old->arena = new_arena;
   n = stb_sdictinternal_copy(old);
   old->arena = old_arena;
   if (n)
      n->arena = new_arena;
   else if (new_arena)
      stb_free(new_arena);
   return n;
}